

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner_test.cc
# Opt level: O2

void __thiscall
AwsCommandRunner_SyncDirectory_Test::TestBody(AwsCommandRunner_SyncDirectory_Test *this)

{
  bool bVar1;
  MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *pMVar2;
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *pTVar3;
  MockSpec<bool_()> *pMVar4;
  TypedExpectation<bool_()> *pTVar5;
  long lVar6;
  char *in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  allocator_type local_399;
  allocator local_398;
  allocator local_397;
  allocator local_396;
  allocator local_395;
  allocator local_394;
  allocator_type local_393;
  allocator local_392;
  allocator local_391;
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330 [32];
  AssertionResult gtest_ar_;
  AwsCommandRunner aws_command_runner;
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  MultipleCommandRunner multiple_command_runner;
  MockCommandRunner command_runner;
  
  anon_unknown.dwarf_103e0::MockCommandRunner::MockCommandRunner(&command_runner);
  MultipleCommandRunner::MultipleCommandRunner
            (&multiple_command_runner,&command_runner.super_CommandRunner);
  std::__cxx11::string::string((string *)&aws_command_runner,"aws",(allocator *)&local_370);
  std::__cxx11::string::string
            ((string *)(aws_command_runner.local_path_.field_2._M_local_buf + 8),"s3",
             (allocator *)&local_390);
  std::__cxx11::string::string
            ((string *)(aws_command_runner.s3_bucket_.field_2._M_local_buf + 8),"rm",&local_397);
  std::__cxx11::string::string
            ((string *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             ,"s3://bucket/foo",&local_398);
  __l._M_len = 4;
  __l._M_array = (iterator)&aws_command_runner;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar_,__l,&local_399);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::Matcher((Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
             *)&local_350,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  pMVar2 = anon_unknown.dwarf_103e0::MockCommandRunner::gmock_RunCommand
                     (&command_runner,
                      (Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                       *)&local_350);
  pTVar3 = testing::internal::
           MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x58,"command_runner",
                      "RunCommand(std::vector<std::string>({ \"aws\", \"s3\", \"rm\", \"s3://bucket/foo\", }))"
                     );
  testing::internal::
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::Times(pTVar3,1);
  testing::internal::
  MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~MatcherBase((MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                  *)&local_350);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  lVar6 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&aws_command_runner.command_runner_ + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string((string *)&aws_command_runner,"aws",(allocator *)&local_370);
  std::__cxx11::string::string
            ((string *)(aws_command_runner.local_path_.field_2._M_local_buf + 8),"s3",
             (allocator *)&local_390);
  std::__cxx11::string::string
            ((string *)(aws_command_runner.s3_bucket_.field_2._M_local_buf + 8),"sync",&local_397);
  std::__cxx11::string::string
            ((string *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             ,"--delete",&local_398);
  std::__cxx11::string::string(local_260,"--exclude",(allocator *)&local_399);
  std::__cxx11::string::string(local_240,"*.jpg",&local_394);
  std::__cxx11::string::string(local_220,"--exclude",&local_395);
  std::__cxx11::string::string(local_200,"*.mp3",&local_396);
  std::__cxx11::string::string(local_1e0,"/tmp/foo",&local_391);
  std::__cxx11::string::string(local_1c0,"s3://bucket/foo",&local_392);
  __l_00._M_len = 10;
  __l_00._M_array = (iterator)&aws_command_runner;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar_,__l_00,&local_393);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::Matcher((Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
             *)&local_350,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  pMVar2 = anon_unknown.dwarf_103e0::MockCommandRunner::gmock_RunCommand
                     (&command_runner,
                      (Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                       *)&local_350);
  pTVar3 = testing::internal::
           MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x5e,"command_runner",
                      "RunCommand(std::vector<std::string>({ \"aws\", \"s3\", \"sync\", \"--delete\", \"--exclude\", \"*.jpg\", \"--exclude\", \"*.mp3\", \"/tmp/foo\", \"s3://bucket/foo\", }))"
                     );
  testing::internal::
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::Times(pTVar3,1);
  testing::internal::
  MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~MatcherBase((MatcherBase<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                  *)&local_350);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  lVar6 = 0x120;
  do {
    std::__cxx11::string::~string((string *)((long)&aws_command_runner.command_runner_ + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  pMVar4 = anon_unknown.dwarf_103e0::MockCommandRunner::gmock_Finished(&command_runner);
  pTVar5 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x60,"command_runner","Finished()");
  local_350._M_dataplus._M_p = (pointer)operator_new(1);
  *local_350._M_dataplus._M_p = '\x01';
  local_350._M_string_length = (size_type)&local_350._M_string_length;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&aws_command_runner);
  testing::internal::TypedExpectation<bool_()>::WillRepeatedly
            (pTVar5,(Action<bool_()> *)&aws_command_runner);
  testing::internal::linked_ptr<testing::ActionInterface<bool_()>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<bool_()>_> *)&aws_command_runner);
  testing::internal::linked_ptr<bool>::~linked_ptr((linked_ptr<bool> *)&local_350);
  pMVar4 = anon_unknown.dwarf_103e0::MockCommandRunner::gmock_PreviousCommandFailed(&command_runner)
  ;
  pTVar5 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x61,"command_runner","PreviousCommandFailed()");
  local_350._M_dataplus._M_p = (pointer)operator_new(1);
  *local_350._M_dataplus._M_p = '\0';
  local_350._M_string_length = (size_type)&local_350._M_string_length;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&aws_command_runner);
  testing::internal::TypedExpectation<bool_()>::WillRepeatedly
            (pTVar5,(Action<bool_()> *)&aws_command_runner);
  testing::internal::linked_ptr<testing::ActionInterface<bool_()>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<bool_()>_> *)&aws_command_runner);
  testing::internal::linked_ptr<bool>::~linked_ptr((linked_ptr<bool> *)&local_350);
  std::__cxx11::string::string((string *)&local_370,"/tmp/",&local_397);
  std::__cxx11::string::string((string *)&local_390,"bucket",&local_398);
  std::__cxx11::string::string((string *)&local_350,"*.jpg",(allocator *)&local_399);
  std::__cxx11::string::string(local_330,"*.mp3",&local_394);
  __l_01._M_len = 2;
  __l_01._M_array = &local_350;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&gtest_ar_,__l_01,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_395,(allocator_type *)&local_396);
  AwsCommandRunner::AwsCommandRunner
            (&aws_command_runner,&multiple_command_runner,&local_370,&local_390,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&gtest_ar_);
  lVar6 = 0x20;
  do {
    std::__cxx11::string::~string(local_330 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string((string *)&local_350,"/tmp/foo",(allocator *)&gtest_ar_);
  AwsCommandRunner::SyncDirectory(&aws_command_runner,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  bVar1 = AwsCommandRunner::Finished(&aws_command_runner);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_370);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_350,(internal *)&gtest_ar_,(AssertionResult *)"aws_command_runner.Finished()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_390,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
               ,0x68,local_350._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_370);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    bVar1 = AwsCommandRunner::PreviousCommandFailed(&aws_command_runner);
    gtest_ar_.success_ = !bVar1;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_370);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_350,(internal *)&gtest_ar_,
                 (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_390,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                 ,0x69,local_350._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_370);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      bVar1 = AwsCommandRunner::Finished(&aws_command_runner);
      gtest_ar_.success_ = !bVar1;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar1) {
        testing::Message::Message((Message *)&local_370);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_350,(internal *)&gtest_ar_,
                   (AssertionResult *)"aws_command_runner.Finished()","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_390,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                   ,0x6a,local_350._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_370)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        bVar1 = AwsCommandRunner::PreviousCommandFailed(&aws_command_runner);
        gtest_ar_.success_ = !bVar1;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar1) {
          testing::Message::Message((Message *)&local_370);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_350,(internal *)&gtest_ar_,
                     (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true","false",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_390,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                     ,0x6b,local_350._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_390,(Message *)&local_370);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          gtest_ar_.success_ = AwsCommandRunner::Finished(&aws_command_runner);
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (gtest_ar_.success_) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_.message_);
            bVar1 = AwsCommandRunner::PreviousCommandFailed(&aws_command_runner);
            gtest_ar_.success_ = !bVar1;
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar1) goto LAB_0015a2c4;
            testing::Message::Message((Message *)&local_370);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_350,(internal *)&gtest_ar_,
                       (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_390,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                       ,0x6d,local_350._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_390,(Message *)&local_370);
          }
          else {
            testing::Message::Message((Message *)&local_370);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_350,(internal *)&gtest_ar_,
                       (AssertionResult *)"aws_command_runner.Finished()","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_390,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                       ,0x6c,local_350._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_390,(Message *)&local_370);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
  std::__cxx11::string::~string((string *)&local_350);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_370);
LAB_0015a2c4:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  AwsCommandRunner::~AwsCommandRunner(&aws_command_runner);
  std::
  deque<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
  ::~deque(&multiple_command_runner.enqueued_commands_.c);
  anon_unknown.dwarf_103e0::MockCommandRunner::~MockCommandRunner(&command_runner);
  return;
}

Assistant:

TEST(AwsCommandRunner, SyncDirectory) {
  MockCommandRunner command_runner;
  MultipleCommandRunner multiple_command_runner(&command_runner);
  EXPECT_CALL(command_runner, RunCommand(std::vector<std::string>({
                                  "aws", "s3", "rm", "s3://bucket/foo",
                              })))
      .Times(1);
  EXPECT_CALL(command_runner,
              RunCommand(std::vector<std::string>({
                  "aws", "s3", "sync", "--delete", "--exclude", "*.jpg",
                  "--exclude", "*.mp3", "/tmp/foo", "s3://bucket/foo",
              })))
      .Times(1);
  EXPECT_CALL(command_runner, Finished()).WillRepeatedly(Return(true));
  EXPECT_CALL(command_runner, PreviousCommandFailed())
      .WillRepeatedly(Return(false));

  AwsCommandRunner aws_command_runner(&multiple_command_runner, "/tmp/",
                                      "bucket", {"*.jpg", "*.mp3"});
  aws_command_runner.SyncDirectory("/tmp/foo");

  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_TRUE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
}